

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O3

void __thiscall
brown::Simulator::setpin
          (Simulator *this,int64_t clk,bool pulx,bool puly,bool dirx,bool diry,bool down)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint32_t ms;
  bool bVar12;
  long lVar13;
  byte *pbVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  byte local_4a;
  byte local_49;
  uint64_t local_48;
  
  local_49 = dirx;
  local_4a = diry;
  if ((this->pclk <= clk) && ((pulx || puly) || this->pclk != clk)) {
    local_48 = clk;
    if ((ulong)(this->CLKFRQ / 10) < clk - setpin::startClk) {
      uVar7 = App::getTime(this->app);
      lVar11 = local_48 - setpin::startClk;
      auVar19._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = 0x45300000;
      uVar15 = (uint)(long)((((auVar19._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                            1000.0) / (double)this->CLKFRQ + 0.0);
      ms = uVar15 - (uVar7 - setpin::startTime);
      if (uVar7 - setpin::startTime <= uVar15 && ms != 0) {
        App::delay(this->app,ms);
      }
      setpin::startClk = local_48;
      setpin::startTime = App::getTime(this->app);
    }
    this->pclk = local_48;
    if (this->fifn < this->FIFMAX) {
      this->fifclk[this->fifn] = local_48;
      sVar5 = this->fifn;
      this->fifcurx[sVar5] = this->acur[0];
      this->fifcury[sVar5] = this->acur[1];
      this->fifbit[sVar5] = down << 4 | diry << 3 | dirx << 2 | puly * '\x02' | pulx;
      this->fifn = this->fifn + 1;
    }
    uVar15 = (this->BMPXRES >> 1) + (this->acur[0] >> 6);
    uVar17 = (this->BMPYRES >> 1) + (this->acur[1] >> 6);
    if (uVar17 < (uint)this->BMPYRES && uVar15 < (uint)this->BMPXRES) {
      puVar8 = Tile::getpix(&this->drawing,uVar15,uVar17);
      if (down) {
        *puVar8 = 0xd0c0b0;
      }
      else if (*puVar8 == 0) {
        puVar8 = Tile::getpix(&this->drawing,uVar15,uVar17);
        *puVar8 = 0x102030;
      }
    }
    lVar9 = (long)this->MAXT;
    iVar1 = this->MINT;
    lVar11 = this->CLKFRQ;
    iVar2 = this->MAXACC;
    iVar3 = this->MINPOS;
    iVar4 = this->MAXPOS;
    uVar15 = this->fault;
    lVar13 = 0;
    pbVar14 = &local_49;
    bVar6 = true;
    do {
      bVar12 = bVar6;
      if ((pulx & 1U) != 0) {
        this->pulcount[lVar13] = this->pulcount[lVar13] + 1;
        lVar16 = this->oclk[lVar13];
        lVar18 = local_48 - lVar16;
        if (lVar9 <= lVar18) {
          this->killax[lVar13] = false;
        }
        uVar17 = (uint)lVar13;
        if (lVar18 < 1) {
          if (uVar15 == 0) {
            uVar15 = uVar17 | 2;
            this->fault = uVar15;
            this->faultclk = local_48;
          }
          this->killax[lVar13] = true;
        }
        else {
          lVar16 = lVar16 - this->ooclk[lVar13];
          if (((lVar16 < lVar9 || lVar18 < lVar9) && (-1 < this->ooclk[lVar13])) &&
             (this->odir[lVar13] != (uint)*pbVar14)) {
            if (uVar15 == 0) {
              uVar15 = uVar17 | 4;
              this->fault = uVar15;
              this->faultclk = local_48;
            }
            this->killax[lVar13] = true;
          }
          if (((lVar18 < iVar1) && (-1 < this->oclk[lVar13])) && (uVar15 == 0)) {
            uVar15 = uVar17 | 6;
            this->fault = uVar15;
            this->faultclk = local_48;
          }
          if (((lVar18 <= lVar9) && (lVar16 <= lVar9)) &&
             ((-1 < this->ooclk[lVar13] &&
              (((double)lVar16 * (double)(lVar16 + lVar18) * (double)lVar18 * (double)iVar2 <=
                (double)lVar11 * (double)lVar11 * ABS((double)(lVar16 - lVar18)) * 2.0 &&
               (this->killax[lVar13] = true, uVar15 == 0)))))) {
            uVar15 = uVar17 | 8;
            this->fault = uVar15;
            this->faultclk = local_48;
          }
          if (this->killax[lVar13] == true) {
            uVar17 = (uint)*pbVar14;
          }
          else {
            uVar17 = (uint)*pbVar14;
            iVar10 = this->acur[lVar13] + uVar17 * 2 + -1;
            if (iVar10 <= iVar3) {
              iVar10 = iVar3;
            }
            if (iVar4 <= iVar10) {
              iVar10 = iVar4;
            }
            this->acur[lVar13] = iVar10;
          }
          iVar10 = this->cur[lVar13] + uVar17 * 2 + -1;
          if (iVar10 <= iVar3) {
            iVar10 = iVar3;
          }
          if (iVar4 <= iVar10) {
            iVar10 = iVar4;
          }
          this->cur[lVar13] = iVar10;
          this->ooclk[lVar13] = this->oclk[lVar13];
          this->oclk[lVar13] = local_48;
          this->odir[lVar13] = uVar17;
        }
      }
      lVar13 = 1;
      pbVar14 = &local_4a;
      bVar6 = false;
      pulx = puly;
    } while (bVar12);
    this->odown = down;
    return;
  }
  App::delay(this->app,0xf);
  return;
}

Assistant:

void Simulator::setpin(std::int64_t clk, bool pulx, bool puly,
                       bool dirx, bool diry, bool down) {
    int x, y;
    bool pul[]{pulx, puly};
    bool dir[]{dirx, diry};

    /* Advance in time */
    if (clk < pclk || (clk==pclk && !pulx && !puly)) {
        app->delay(15);
        return;
    }
    // delay
    static std::uint32_t startTime = 0; // ms
    static std::uint64_t startClk = 0; // tick
    double delayTime = 0; // ms (for sub ms accuracy)
    if ((clk-startClk) > (CLKFRQ/10)) { // handle delay every 100 ms emulated time
        std::uint32_t elapsedTime = app->getTime() - startTime;
        delayTime += static_cast<double>((clk-startClk))*1000.0/TIME_SCALE/CLKFRQ;
        std::uint32_t delayTimeFloor = static_cast<std::uint32_t>(delayTime);
        if (delayTimeFloor > elapsedTime) {
            app->delay(delayTimeFloor-elapsedTime);
            delayTime -= delayTimeFloor;
        } else {
            delayTime = 0;
        }
        startClk = clk;
        startTime = app->getTime();
    }
    pclk = clk;

    /* Log data */
    if (fifn < FIFMAX) {
        fifclk[fifn] = clk;
        fifcurx[fifn] = acur[0];
        fifcury[fifn] = acur[1];
        fifbit[fifn] = pulx + (puly<<1) + (dirx<<2) + (diry<<3) + (down<<4);
        fifn++;
    }

    /* Draw previous pen location */
    x = (acur[0]>>6)+(BMPXRES>>1);
    y = (acur[1]>>6)+(BMPYRES>>1);
    if (((unsigned)x < (unsigned)BMPXRES)
    && ((unsigned)y < (unsigned)BMPYRES)) {
        if (down) {
            drawing.getpix(x, y) = DOWN_COLOR;
        }
        else if (drawing.getpix(x, y) == BACKGROUND_COLOR) {
            drawing.getpix(x, y) = UP_COLOR;
        }
    }

    /* Move pen and apply restriction*/
    for(int i = 0; i < 2; i++) {
        if (!pul[i]) {continue;}
#if ENABLE_RESTRICTION
        pulcount[i]++;
        std::int64_t t0 = clk - oclk[i];
        std::int64_t t1 = oclk[i] - ooclk[i];

        // Unlock axis after slowing down
        if (t0 >= MAXT) {killax[i] = false;}

        // Fault 2/3: zero clk between pulses
        if (t0 <= 0) {
            if (!fault) {fault = i+2; faultclk = clk;}
            killax[i] = 1; continue;
        }

        // Fault 4/5: change direction at high speed
        if (((t0 < MAXT) || (t1 < MAXT)) && (ooclk[i] >= 0) && (dir[i] != odir[i])) {
            if (!fault) {fault = i+4; faultclk = clk; }
            killax[i] = 1;
        }

        // Fault 6/7: speeding
        if ((t0 < MINT) && (oclk[i] >= 0)) {
            if (!fault) {fault = i+6; faultclk = clk;}
        }

        // Fault 8/9: over-acceleration
        if ((t0 <= MAXT) && (t1 <= MAXT) && (ooclk[i] >= 0)) {
            if (fabs((double)(t1-t0))*CLKFRQ*CLKFRQ*2.0 >= (double)(t0+t1)*t0*t1*MAXACC) {
                killax[i] = 1;
                if (!fault) {fault = i+8; faultclk = clk; }
            }
        }

        if (!killax[i]) {
            acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
        }
#else
        acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
#endif // ENABLE_RESTRICTION

        cur[i] = min(max(cur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);

        ooclk[i] = oclk[i];
        oclk[i] = clk;
        odir[i] = dir[i];
    }
    odown = down;
}